

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_prune_partitions_by_max_min_bsize(SuperBlockEnc *sb_enc,PartitionSearchState *part_state)

{
  uint uVar1;
  long lVar2;
  
  if (block_size_wide[sb_enc->max_partition_size] <
      block_size_wide[(part_state->part_blk_params).bsize]) {
    part_state->partition_none_allowed = 0;
    part_state->partition_rect_allowed[0] = 0;
    part_state->do_rectangular_split = 0;
    part_state->do_square_split = 1;
    uVar1 = 0;
    lVar2 = 0x124;
  }
  else {
    if (block_size_wide[sb_enc->min_partition_size] <
        block_size_wide[(part_state->part_blk_params).bsize]) {
      return;
    }
    part_state->do_rectangular_split = 0;
    part_state->partition_rect_allowed[0] = 0;
    part_state->partition_rect_allowed[1] = 0;
    if (((part_state->part_blk_params).has_rows != 0) &&
       ((part_state->part_blk_params).has_cols != 0)) {
      part_state->do_square_split = 0;
    }
    uVar1 = (uint)(part_state->do_square_split == 0);
    lVar2 = 0x11c;
  }
  *(uint *)((long)part_state->split_part_rect_win[0].rect_part_win + lVar2 + -0x34) = uVar1;
  return;
}

Assistant:

void av1_prune_partitions_by_max_min_bsize(SuperBlockEnc *sb_enc,
                                           PartitionSearchState *part_state) {
  assert(is_bsize_square(sb_enc->max_partition_size));
  assert(is_bsize_square(sb_enc->min_partition_size));
  assert(sb_enc->min_partition_size <= sb_enc->max_partition_size);
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const BLOCK_SIZE bsize = blk_params->bsize;
  assert(is_bsize_square(bsize));
  const int max_partition_size_1d = block_size_wide[sb_enc->max_partition_size];
  const int min_partition_size_1d = block_size_wide[sb_enc->min_partition_size];
  const int bsize_1d = block_size_wide[bsize];
  assert(min_partition_size_1d <= max_partition_size_1d);
  const int is_le_min_sq_part = bsize_1d <= min_partition_size_1d;
  const int is_gt_max_sq_part = bsize_1d > max_partition_size_1d;
  if (is_gt_max_sq_part) {
    // If current block size is larger than max, only allow split.
    av1_set_square_split_only(part_state);
  } else if (is_le_min_sq_part) {
    // If current block size is less or equal to min, only allow none if valid
    // block large enough; only allow split otherwise.
    av1_disable_rect_partitions(part_state);

    // only disable square split when current block is not at the picture
    // boundary. otherwise, inherit the square split flag from previous logic
    if (av1_blk_has_rows_and_cols(blk_params)) {
      part_state->do_square_split = 0;
    }
    part_state->partition_none_allowed = !(part_state->do_square_split);
  }
}